

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ge_p2_dbl.c
# Opt level: O2

void crypto_sign_ed25519_ref10_ge_p2_dbl(ge_p1p1 *r,ge_p2 *p)

{
  int32_t *h;
  int32_t *h_00;
  int32_t *h_01;
  fe t0;
  int32_t aiStack_58 [10];
  
  crypto_sign_ed25519_ref10_fe_sq(r->X,p->X);
  h = r->Z;
  crypto_sign_ed25519_ref10_fe_sq(h,p->Y);
  h_00 = r->T;
  crypto_sign_ed25519_ref10_fe_sq2(h_00,p->Z);
  h_01 = r->Y;
  crypto_sign_ed25519_ref10_fe_add(h_01,p->X,p->Y);
  crypto_sign_ed25519_ref10_fe_sq(aiStack_58,h_01);
  crypto_sign_ed25519_ref10_fe_add(h_01,h,r->X);
  crypto_sign_ed25519_ref10_fe_sub(h,h,r->X);
  crypto_sign_ed25519_ref10_fe_sub(r->X,aiStack_58,h_01);
  crypto_sign_ed25519_ref10_fe_sub(h_00,h_00,h);
  return;
}

Assistant:

void ge_p2_dbl(ge_p1p1 *r,const ge_p2 *p)
{
  fe t0;
#include "ge_p2_dbl.h"
}